

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher_list<bool_(int)>::~call_matcher_list(call_matcher_list<bool_(int)> *this)

{
  call_matcher_list<bool_(int)> *this_local;
  
  list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>::~list
            (&this->
              super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }